

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_metadata.h
# Opt level: O3

void __thiscall
draco::GeometryMetadata::DeleteAttributeMetadataByUniqueId
          (GeometryMetadata *this,int32_t att_unique_id)

{
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> *puVar1;
  iterator __position;
  
  if (-1 < att_unique_id) {
    __position._M_current =
         (this->att_metadatas_).
         super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->att_metadatas_).
             super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current != puVar1) {
      do {
        if ((((__position._M_current)->_M_t).
             super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
             .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl)->att_unique_id_
            == att_unique_id) {
          std::
          vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
          ::_M_erase(&this->att_metadatas_,__position);
          return;
        }
        __position._M_current = __position._M_current + 1;
      } while (__position._M_current != puVar1);
    }
  }
  return;
}

Assistant:

void DeleteAttributeMetadataByUniqueId(int32_t att_unique_id) {
    if (att_unique_id < 0) {
      return;
    }
    for (auto itr = att_metadatas_.begin(); itr != att_metadatas_.end();
         ++itr) {
      if (itr->get()->att_unique_id() == static_cast<uint32_t>(att_unique_id)) {
        att_metadatas_.erase(itr);
        return;
      }
    }
  }